

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

LPBYTE __thiscall TRootHandler_MNDX::GetKey(TRootHandler_MNDX *this,char *szFileName,PDWORD param_2)

{
  int iVar1;
  PMNDX_PACKAGE p_Var2;
  char local_448 [4];
  int nError;
  char szNormName [1025];
  char *szStrippedName;
  PMNDX_PACKAGE pPackage;
  PMNDX_ROOT_ENTRY pRootEntry;
  PDWORD param_2_local;
  char *szFileName_local;
  TRootHandler_MNDX *this_local;
  
  pPackage = (PMNDX_PACKAGE)0x0;
  pRootEntry = (PMNDX_ROOT_ENTRY)param_2;
  param_2_local = (PDWORD)szFileName;
  szFileName_local = (char *)this;
  NormalizeFileName_LowerSlash(local_448,szFileName,0x400);
  p_Var2 = FindMndxPackage(this,local_448);
  if (p_Var2 == (PMNDX_PACKAGE)0x0) {
    this_local = (TRootHandler_MNDX *)0x0;
  }
  else {
    for (register0x00000000 = local_448 + p_Var2->nLength; *stack0xffffffffffffffc0 == '/';
        register0x00000000 = stack0xffffffffffffffc0 + 1) {
    }
    iVar1 = SearchMndxInfo(this,stack0xffffffffffffffc0,p_Var2->nIndex,(PMNDX_ROOT_ENTRY *)&pPackage
                          );
    if ((iVar1 == 0) && (pPackage != (PMNDX_PACKAGE)0x0)) {
      this_local = (TRootHandler_MNDX *)((long)&pPackage->szFileName + 4);
    }
    else {
      this_local = (TRootHandler_MNDX *)0x0;
    }
  }
  return (LPBYTE)this_local;
}

Assistant:

LPBYTE GetKey(const char * szFileName, PDWORD /* PtrFileSize */)
    {
        PMNDX_ROOT_ENTRY pRootEntry = NULL;
        PMNDX_PACKAGE pPackage;
        char * szStrippedName;
        char szNormName[MAX_PATH+1];
        int nError;

        // Convert the file name to lowercase + slashes
        NormalizeFileName_LowerSlash(szNormName, szFileName, MAX_PATH);

        // Find the package number
        pPackage = FindMndxPackage(szNormName);
        if(pPackage == NULL)
            return NULL;

        // Cut the package name off the full path
        szStrippedName = szNormName + pPackage->nLength;
        while(szStrippedName[0] == '/')
            szStrippedName++;

        // Find the root entry
        nError = SearchMndxInfo(szStrippedName, (DWORD)(pPackage->nIndex), &pRootEntry);
        if(nError != ERROR_SUCCESS || pRootEntry == NULL)
            return NULL;

        // Return the CKey
        return pRootEntry->CKey;
    }